

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opmath.cpp
# Opt level: O3

int32_t op_shift_right_unsigned(int32_t value,int32_t amount)

{
  int32_t iVar1;
  uint uVar2;
  
  uVar2 = value;
  if ((amount != 0) && (uVar2 = 0, -0x20 < amount && value != 0)) {
    if (amount < 0x20) {
      if (amount < 0) {
        iVar1 = op_shift_left(value,-amount);
        return iVar1;
      }
      uVar2 = (uint)value >> ((byte)amount & 0x1f);
    }
    else {
      uVar2 = value >> 0x1f;
    }
  }
  return uVar2;
}

Assistant:

int32_t op_shift_right_unsigned(int32_t value, int32_t amount)
{
	// Repeat the easy cases here to avoid INT_MIN funny business
	if (amount == 0)
		return value;
	if (value == 0 || amount <= -32)
		return 0;
	if (amount > 31)
		return (value < 0) ? -1 : 0;
	if (amount < 0)
		return op_shift_left(value, -amount);

	return (uint32_t)value >> amount;
}